

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::initializeScheme(XMLUri *this,XMLCh *uriSpec)

{
  MemoryManager *pMVar1;
  int iVar2;
  XMLCh *pXVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  MalformedURLException *this_00;
  ArrayJanitor<char16_t> tmpName;
  XMLCh *toDelete;
  
  pXVar3 = XMLString::findAny(uriSpec,(XMLCh *)SCHEME_SEPARATORS);
  if (pXVar3 != (XMLCh *)0x0) {
    pMVar1 = this->fMemoryManager;
    XVar4 = XMLString::stringLen(uriSpec);
    iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,XVar4 * 2 + 2);
    toDelete = (XMLCh *)CONCAT44(extraout_var,iVar2);
    ArrayJanitor<char16_t>::ArrayJanitor(&tmpName,toDelete,this->fMemoryManager);
    XMLString::subString(toDelete,uriSpec,0,(long)pXVar3 - (long)uriSpec >> 1,this->fMemoryManager);
    setScheme(this,toDelete);
    ArrayJanitor<char16_t>::~ArrayJanitor(&tmpName);
    return;
  }
  this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
  MalformedURLException::MalformedURLException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
             ,0x32b,XMLNUM_URI_No_Scheme,this->fMemoryManager);
  __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLUri::initializeScheme(const XMLCh* const uriSpec)
{
    const XMLCh* tmpPtr = XMLString::findAny(uriSpec, SCHEME_SEPARATORS);

    if ( !tmpPtr )
    {
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::XMLNUM_URI_No_Scheme, fMemoryManager);
    }
	else
    {
        XMLCh* scheme = (XMLCh*) fMemoryManager->allocate
        (
            (XMLString::stringLen(uriSpec) + 1) * sizeof(XMLCh)
        );//new XMLCh[XMLString::stringLen(uriSpec)+1];
        ArrayJanitor<XMLCh> tmpName(scheme, fMemoryManager);
        XMLString::subString(scheme, uriSpec, 0, (tmpPtr - uriSpec), fMemoryManager);
        setScheme(scheme);
	}

}